

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QNtlmBuffer *b)

{
  QDataStream *pQVar1;
  
  pQVar1 = (QDataStream *)QDataStream::operator>>(s,(short *)b);
  pQVar1 = (QDataStream *)QDataStream::operator>>(pQVar1,(short *)&b->maxLen);
  QDataStream::operator>>(pQVar1,(int *)&b->offset);
  return s;
}

Assistant:

static QDataStream& operator>>(QDataStream& s, QNtlmBuffer& b)
{
    s >> b.len >> b.maxLen >> b.offset;
    return s;
}